

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
     ::serialize<OutputStream>
               (unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                *s,OutputStream *ostream)

{
  undefined4 uVar1;
  size_type sVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint32_t size32;
  size_type size;
  OutputStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar2 = sequence_size<std::unordered_map<int,char,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,char>>>>
                    ((unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
                      *)0x1920e8);
  uVar1 = (undefined4)sVar2;
  serialize<unsigned_int,OutputStream>
            ((uint *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  serialize_elems<OutputStream>(in_RDI,uVar1,in_RSI);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }